

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqllogictest.cpp
# Opt level: O2

void testRunner<false,true>(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  IResultCapture *pIVar4;
  IMutableContext *pIVar5;
  undefined4 extraout_var;
  long lVar6;
  InvalidInputException *this;
  allocator local_41a;
  allocator local_419;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> test_working_dir;
  string prev_directory;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  string initial_dbpath;
  string name;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  SQLLogicTestRunner runner;
  
  pIVar4 = Catch::getResultCapture();
  (*pIVar4->_vptr_IResultCapture[0x15])(&name,pIVar4);
  paVar1 = &initial_dbpath.field_2;
  initial_dbpath._M_string_length = 0;
  initial_dbpath.field_2._M_local_buf[0] = '\0';
  initial_dbpath._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = duckdb::TestForceStorage();
  if (bVar2) {
    std::__cxx11::string::string(local_298,(string *)&name);
    std::__cxx11::string::string((string *)&prev_directory,"/",(allocator *)&local_3d8);
    std::__cxx11::string::string((string *)&test_working_dir,"_",&local_41a);
    duckdb::StringUtil::Replace(&runner,local_298,&prev_directory,&test_working_dir);
    std::__cxx11::string::~string((string *)&test_working_dir);
    std::__cxx11::string::~string((string *)&prev_directory);
    std::__cxx11::string::~string(local_298);
    std::__cxx11::string::string(local_2b8,(string *)&runner);
    std::__cxx11::string::string((string *)&test_working_dir,".",&local_41a);
    std::__cxx11::string::string((string *)&local_3d8,"_",&local_419);
    duckdb::StringUtil::Replace(&prev_directory,local_2b8,&test_working_dir,&local_3d8);
    std::__cxx11::string::operator=((string *)&runner,(string *)&prev_directory);
    std::__cxx11::string::~string((string *)&prev_directory);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&test_working_dir);
    std::__cxx11::string::~string(local_2b8);
    std::__cxx11::string::string(local_2d8,(string *)&runner);
    std::__cxx11::string::string((string *)&test_working_dir,"\\",&local_41a);
    std::__cxx11::string::string((string *)&local_3d8,"_",&local_419);
    duckdb::StringUtil::Replace(&prev_directory,local_2d8,&test_working_dir,&local_3d8);
    std::__cxx11::string::operator=((string *)&runner,(string *)&prev_directory);
    std::__cxx11::string::~string((string *)&prev_directory);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&test_working_dir);
    std::__cxx11::string::~string(local_2d8);
    std::operator+(&local_2f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&runner,
                   ".db");
    duckdb::TestCreatePath(&prev_directory,(string *)&local_2f8);
    std::__cxx11::string::operator=((string *)&initial_dbpath,(string *)&prev_directory);
    std::__cxx11::string::~string((string *)&prev_directory);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&runner);
  }
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)initial_dbpath._M_dataplus._M_p == paVar1) {
    local_378.field_2._8_8_ = initial_dbpath.field_2._8_8_;
  }
  else {
    local_378._M_dataplus._M_p = initial_dbpath._M_dataplus._M_p;
  }
  local_378.field_2._M_allocated_capacity._1_7_ = initial_dbpath.field_2._M_allocated_capacity._1_7_
  ;
  local_378.field_2._M_local_buf[0] = initial_dbpath.field_2._M_local_buf[0];
  local_378._M_string_length = initial_dbpath._M_string_length;
  initial_dbpath._M_string_length = 0;
  initial_dbpath.field_2._M_local_buf[0] = '\0';
  initial_dbpath._M_dataplus._M_p = (pointer)paVar1;
  duckdb::SQLLogicTestRunner::SQLLogicTestRunner(&runner,&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  pIVar5 = Catch::getCurrentMutableContext();
  iVar3 = (*(pIVar5->super_IContext)._vptr_IContext[4])(pIVar5);
  runner.output_sql = (bool)(**(code **)(**(long **)CONCAT44(extraout_var,iVar3) + 0xb8))();
  runner.enable_verification = false;
  prev_directory._M_dataplus._M_p = (pointer)&prev_directory.field_2;
  prev_directory._M_string_length = 0;
  prev_directory.field_2._M_local_buf[0] = '\0';
  duckdb::TestGetCurrentDirectory_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&prev_directory,(string *)&test_working_dir);
  std::__cxx11::string::~string((string *)&test_working_dir);
  lVar6 = std::__cxx11::string::rfind((char *)&name,0x4781ec);
  if (lVar6 != -1) {
    std::__cxx11::string::substr((ulong)&test_working_dir,(ulong)&name);
    std::__cxx11::string::string((string *)&local_318,(string *)&test_working_dir);
    duckdb::TestChangeDirectory(&local_318);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&test_working_dir);
    std::__cxx11::string::string((string *)&local_338,(string *)&name);
    duckdb::SQLLogicTestRunner::ExecuteFile(&runner,&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::string((string *)&local_358,(string *)&prev_directory);
    duckdb::TestChangeDirectory(&local_358);
    std::__cxx11::string::~string((string *)&local_358);
    duckdb::ClearTestDirectory();
    std::__cxx11::string::~string((string *)&prev_directory);
    duckdb::SQLLogicTestRunner::~SQLLogicTestRunner(&runner);
    std::__cxx11::string::~string((string *)&initial_dbpath);
    std::__cxx11::string::~string((string *)&name);
    return;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  std::operator+(&local_3d8,"Failed to auto detect working dir for test \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &test_working_dir,&local_3d8,"\' because a non-standard path was used!");
  duckdb::InvalidInputException::InvalidInputException(this,(string *)&test_working_dir);
  __cxa_throw(this,&duckdb::InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void testRunner() {
	// this is an ugly hack that uses the test case name to pass the script file
	// name if someone has a better idea...
	auto name = Catch::getResultCapture().getCurrentTestName();
	// fprintf(stderr, "%s\n", name.c_str());
	string initial_dbpath;
	if (TestForceStorage()) {
		auto storage_name = StringUtil::Replace(name, "/", "_");
		storage_name = StringUtil::Replace(storage_name, ".", "_");
		storage_name = StringUtil::Replace(storage_name, "\\", "_");
		initial_dbpath = TestCreatePath(storage_name + ".db");
	}
	SQLLogicTestRunner runner(std::move(initial_dbpath));
	runner.output_sql = Catch::getCurrentContext().getConfig()->outputSQL();
	runner.enable_verification = VERIFICATION;

	string prev_directory;

	// We assume the test working dir for extensions to be one dir above the test/sql. Note that this is very hacky.
	// however for now it suffices: we use it to run tests from out-of-tree extensions that are based on the extension
	// template which adheres to this convention.
	if (AUTO_SWITCH_TEST_DIR) {
		prev_directory = TestGetCurrentDirectory();

		std::size_t found = name.rfind("test/sql");
		if (found == std::string::npos) {
			throw InvalidInputException("Failed to auto detect working dir for test '" + name +
			                            "' because a non-standard path was used!");
		}
		auto test_working_dir = name.substr(0, found);

		// Parse the test dir automatically
		TestChangeDirectory(test_working_dir);
	}

	runner.ExecuteFile(name);

	if (AUTO_SWITCH_TEST_DIR) {
		TestChangeDirectory(prev_directory);
	}

	// clear test directory after running tests
	ClearTestDirectory();
}